

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

hts_idx_t * sam_index_load(samFile *fp,char *fn)

{
  htsExactFormat hVar1;
  int iVar2;
  hts_idx_t *phVar3;
  
  hVar1 = (fp->format).format;
  if (hVar1 == cram) {
    iVar2 = cram_index_load((fp->fp).cram,fn);
    if ((-1 < iVar2) && (phVar3 = (hts_idx_t *)malloc(0x10), phVar3 != (hts_idx_t *)0x0)) {
      phVar3->fmt = 3;
      *(anon_union_8_4_cbf30dc3_for_fp *)&phVar3->n_lvls = fp->fp;
      return phVar3;
    }
  }
  else if (hVar1 == bam) {
    phVar3 = hts_idx_load(fn,1);
    return phVar3;
  }
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *sam_index_load(samFile *fp, const char *fn)
{
    switch (fp->format.format) {
    case bam:
        return bam_index_load(fn);

    case cram: {
        if (cram_index_load(fp->fp.cram, fn) < 0) return NULL;
        // Cons up a fake "index" just pointing at the associated cram_fd:
        hts_cram_idx_t *idx = malloc(sizeof (hts_cram_idx_t));
        if (idx == NULL) return NULL;
        idx->fmt = HTS_FMT_CRAI;
        idx->cram = fp->fp.cram;
        return (hts_idx_t *) idx;
        }

    default:
        return NULL; // TODO Would use tbx_index_load if it returned hts_idx_t
    }
}